

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::EnsureInlineSlotCapacityIsLocked
          (PathTypeHandlerBase *this,bool startFromRoot)

{
  PathTypeSuccessorInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  RecyclerWeakReference<Js::DynamicType> *typeWeakReference;
  RecyclerWeakReference<Js::DynamicType> *extraout_RDX;
  RecyclerWeakReference<Js::DynamicType> *typeWeakReference_00;
  RecyclerWeakReference<Js::DynamicType> *extraout_RDX_00;
  long lVar6;
  undefined7 in_register_00000031;
  PathTypeSuccessorKey PVar7;
  ulong uVar8;
  int iVar9;
  
  PVar7._1_7_ = in_register_00000031;
  PVar7.propertyId._0_1_ = startFromRoot;
  while (((ulong)PVar7 & 1) != 0) {
    this = GetRootPathTypeHandler(this);
    PVar7.propertyId = 0;
    PVar7.attributes = ObjectSlotAttr_None;
    PVar7._5_3_ = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
    pPVar1 = (this->successorInfo).ptr;
    if (pPVar1 != (PathTypeSuccessorInfo *)0x0) {
      if (pPVar1->kind == PathTypeSuccessorKindSingle) {
        if (*(anon_class_1_0_00000001_for_fn **)(pPVar1 + 0x10) !=
            (anon_class_1_0_00000001_for_fn *)0x0) {
          anon_func::anon_class_1_1_3fcf6586::anon_class_1_1_3fcf6586_for_fn::
          anon_class_1_0_00000001_for_fn::operator()
                    (*(anon_class_1_0_00000001_for_fn **)(pPVar1 + 0x10),PVar7,typeWeakReference);
          return;
        }
      }
      else {
        lVar6 = *(long *)(pPVar1 + 8);
        typeWeakReference_00 = typeWeakReference;
        if (lVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          PVar7.propertyId = 0xdf;
          PVar7.attributes = ObjectSlotAttr_None;
          PVar7._5_3_ = 0;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xdf,"(this->propertySuccessors)","this->propertySuccessors")
          ;
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
          lVar6 = *(long *)(pPVar1 + 8);
          typeWeakReference_00 = extraout_RDX;
        }
        for (uVar8 = 0; uVar8 < *(uint *)(lVar6 + 0x24); uVar8 = uVar8 + 1) {
          iVar9 = *(int *)(*(long *)(lVar6 + 8) + uVar8 * 4);
          if (iVar9 != -1) {
            while (iVar9 != -1) {
              lVar5 = (long)iVar9;
              iVar9 = *(int *)(*(long *)(lVar6 + 0x10) + 8 + lVar5 * 0x18);
              anon_func::anon_class_1_1_3fcf6586::anon_class_1_1_3fcf6586_for_fn::
              anon_class_1_0_00000001_for_fn::operator()
                        (*(anon_class_1_0_00000001_for_fn **)
                          (*(long *)(lVar6 + 0x10) + lVar5 * 0x18),PVar7,typeWeakReference_00);
              typeWeakReference_00 = extraout_RDX_00;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::EnsureInlineSlotCapacityIsLocked(bool startFromRoot)
    {
        if (startFromRoot)
        {
            GetRootPathTypeHandler()->EnsureInlineSlotCapacityIsLocked(false);
            return;
        }

        Assert(!startFromRoot);

        if (!GetIsInlineSlotCapacityLocked())
        {
            SetIsInlineSlotCapacityLocked();

            this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType> * typeWeakReference)
            {
                DynamicType * type = typeWeakReference->Get();
                if (!type)
                {
                    return;
                }

                DynamicTypeHandler* successorTypeHandler = type->GetTypeHandler();
                successorTypeHandler->IsPathTypeHandler() ?
                    PathTypeHandlerBase::FromTypeHandler(successorTypeHandler)->EnsureInlineSlotCapacityIsLocked(false) :
                    successorTypeHandler->EnsureInlineSlotCapacityIsLocked();
            });
        }
    }